

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O2

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> QVar2;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *pQVar3;
  qreal qVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      blurRadiusChanged((QGraphicsBlurEffect *)_o,*_a[1]);
      return;
    case 1:
      blurHintsChanged((QGraphicsBlurEffect *)_o,
                       (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>)
                       ((QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1])->
                       super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>);
      return;
    case 2:
      pQVar3 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1];
LAB_003758e8:
      setBlurRadius((QGraphicsBlurEffect *)_o,*(qreal *)pQVar3);
      return;
    case 3:
      pQVar3 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)_a[1];
LAB_003758f6:
      setBlurHints((QGraphicsBlurEffect *)_o,
                   (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>)
                   pQVar3->super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>);
      return;
    }
    break;
  case ReadProperty:
    pQVar3 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a;
    if (_id == 1) {
      QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
           (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)blurHints((QGraphicsBlurEffect *)_o);
      pQVar3->super_QFlagsStorage<QGraphicsBlurEffect::BlurHint> =
           QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i;
    }
    else if (_id == 0) {
      qVar4 = blurRadius((QGraphicsBlurEffect *)_o);
      *(qreal *)pQVar3 = qVar4;
    }
    break;
  case WriteProperty:
    pQVar3 = (QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *)*_a;
    if (_id == 1) goto LAB_003758f6;
    if (_id == 0) goto LAB_003758e8;
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::indexOfMethod<void(QGraphicsBlurEffect::*)(double)>
                      ((QtMocHelpers *)_a,(void **)blurRadiusChanged,0,0);
    if (!bVar1) {
      QtMocHelpers::
      indexOfMethod<void(QGraphicsBlurEffect::*)(QFlags<QGraphicsBlurEffect::BlurHint>)>
                ((QtMocHelpers *)_a,(void **)blurHintsChanged,0,1);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsBlurEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsBlurEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->blurHintsChanged((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        case 2: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setBlurHints((*reinterpret_cast< std::add_pointer_t<BlurHints>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(qreal )>(_a, &QGraphicsBlurEffect::blurRadiusChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsBlurEffect::*)(BlurHints )>(_a, &QGraphicsBlurEffect::blurHintsChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 1: QtMocHelpers::assignFlags<BlurHints>(_v, _t->blurHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setBlurHints(*reinterpret_cast<BlurHints*>(_v)); break;
        default: break;
        }
    }
}